

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.h
# Opt level: O2

size_t __thiscall
mocker::detail::InterferenceGraph::NodePairHash::operator()(NodePairHash *this,NodePair *nodePair)

{
  size_t sVar1;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_50,
                 &((nodePair->first).
                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  identifier,",");
  std::operator+(&local_30,&local_50,
                 &((nodePair->second).
                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  identifier);
  sVar1 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()(&local_51,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return sVar1;
}

Assistant:

std::size_t operator()(const NodePair &nodePair) const {
      return std::hash<std::string>{}(nodePair.first->getIdentifier() + "," +
                                      nodePair.second->getIdentifier());
    }